

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialSurfaceSMC.cpp
# Opt level: O2

void __thiscall
chrono::ChMaterialSurfaceSMC::ArchiveIN(ChMaterialSurfaceSMC *this,ChArchiveIn *marchive)

{
  ChNameValue<float> local_f0;
  ChNameValue<float> local_d8;
  ChNameValue<float> local_c0;
  ChNameValue<float> local_a8;
  ChNameValue<float> local_90;
  ChNameValue<float> local_78;
  ChNameValue<float> local_60;
  ChNameValue<float> local_48;
  ChNameValue<float> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChMaterialSurfaceSMC>(marchive);
  ChMaterialSurface::ArchiveIN(&this->super_ChMaterialSurface,marchive);
  local_30._value = (float *)&(this->super_ChMaterialSurface).field_0x1c;
  local_30._name = "young_modulus";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->poisson_ratio;
  local_48._name = "poisson_ratio";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  local_60._value = &this->constant_adhesion;
  local_60._name = "constant_adhesion";
  local_60._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_60);
  local_78._value = &this->adhesionMultDMT;
  local_78._name = "adhesionMultDMT";
  local_78._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_78);
  local_90._value = &this->adhesionSPerko;
  local_90._name = "adhesionSPerko";
  local_90._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_90);
  local_a8._value = &this->kn;
  local_a8._name = "kn";
  local_a8._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_a8);
  local_c0._value = &this->kt;
  local_c0._name = "kt";
  local_c0._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_c0);
  local_d8._value = &this->gn;
  local_d8._name = "gn";
  local_d8._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_d8);
  local_f0._value = &this->gt;
  local_f0._name = "gt";
  local_f0._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_f0);
  return;
}

Assistant:

void ChMaterialSurfaceSMC::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChMaterialSurfaceSMC>();

    // deserialize parent class
    ChMaterialSurface::ArchiveIN(marchive);

    // stream in all member data:
    marchive >> CHNVP(young_modulus);
    marchive >> CHNVP(poisson_ratio);
    marchive >> CHNVP(constant_adhesion);
    marchive >> CHNVP(adhesionMultDMT);
    marchive >> CHNVP(adhesionSPerko);
    marchive >> CHNVP(kn);
    marchive >> CHNVP(kt);
    marchive >> CHNVP(gn);
    marchive >> CHNVP(gt);
}